

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.h
# Opt level: O0

void __thiscall HighsSimplexAnalysis::HighsSimplexAnalysis(HighsSimplexAnalysis *this)

{
  HighsValueDistribution *this_00;
  undefined8 *in_RDI;
  HighsValueDistribution *in_stack_ffffffffffffff40;
  undefined8 *local_b8;
  undefined8 *local_a0;
  undefined8 *local_78;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  *in_RDI = 0;
  std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::vector
            ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)0x4b31f7);
  std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::vector
            ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)0x4b3210);
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 10),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xe),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  HighsLogOptions::HighsLogOptions((HighsLogOptions *)in_stack_ffffffffffffff40);
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  *(undefined1 *)((long)in_RDI + 0xf1) = 0;
  *(undefined1 *)((long)in_RDI + 0xf2) = 0;
  *(undefined1 *)((long)in_RDI + 0xf3) = 0;
  *(undefined1 *)((long)in_RDI + 0xf4) = 0;
  *(undefined1 *)((long)in_RDI + 0xf5) = 0;
  *(undefined1 *)((long)in_RDI + 0xf6) = 0;
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  *(undefined4 *)((long)in_RDI + 0xfc) = 2;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x104) = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  *(undefined4 *)((long)in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x24),"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  *(undefined4 *)(in_RDI + 0x3a) = 0;
  in_RDI[0x3b] = 0;
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  in_RDI[0x44] = 0;
  *(undefined4 *)(in_RDI + 0x45) = 0;
  in_RDI[0x46] = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined4 *)((long)in_RDI + 0x23c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)((long)in_RDI + 0x244) = 0;
  *(undefined4 *)(in_RDI + 0x49) = 0;
  *(undefined4 *)((long)in_RDI + 0x24c) = 0;
  *(undefined4 *)(in_RDI + 0x4a) = 0;
  *(undefined4 *)((long)in_RDI + 0x254) = 0;
  *(undefined4 *)(in_RDI + 0x4b) = 0;
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  HighsValueDistribution::HighsValueDistribution(in_stack_ffffffffffffff40);
  *(undefined4 *)(in_RDI + 0x10a) = 0;
  *(undefined4 *)((long)in_RDI + 0x854) = 0;
  *(undefined4 *)(in_RDI + 0x10b) = 0;
  *(undefined4 *)((long)in_RDI + 0x85c) = 0;
  in_RDI[0x10c] = 0;
  in_RDI[0x10d] = 0;
  *(undefined4 *)(in_RDI + 0x10e) = 0;
  *(undefined4 *)((long)in_RDI + 0x874) = 0;
  *(undefined4 *)(in_RDI + 0x10f) = 0;
  *(undefined4 *)((long)in_RDI + 0x87c) = 0;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  in_RDI[0x111] = 0x7ff0000000000000;
  in_RDI[0x112] = 0;
  *(undefined4 *)(in_RDI + 0x113) = 0;
  in_RDI[0x114] = 0;
  in_RDI[0x115] = 0;
  *(undefined4 *)(in_RDI + 0x116) = 0;
  *(undefined4 *)((long)in_RDI + 0x8b4) = 0;
  in_RDI[0x117] = 0;
  in_RDI[0x118] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4b371f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4b3733);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4b3747);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x4b375b);
  std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::vector
            ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)0x4b376f);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            ((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff40);
  *(undefined4 *)(in_RDI + 0x129) = 0;
  *(undefined4 *)((long)in_RDI + 0x94c) = 0;
  *(undefined4 *)(in_RDI + 0x12a) = 0;
  *(undefined4 *)((long)in_RDI + 0x954) = 0;
  in_RDI[299] = 0;
  in_RDI[300] = 0;
  in_RDI[0x12d] = 0;
  in_RDI[0x12e] = 0;
  in_RDI[0x12f] = 0;
  in_RDI[0x130] = 0;
  in_RDI[0x131] = 0;
  in_RDI[0x132] = 0;
  in_RDI[0x133] = 0;
  in_RDI[0x134] = 0;
  *(undefined4 *)(in_RDI + 0x135) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x9ac) = 0xffffffff;
  in_RDI[0x136] = 0;
  in_RDI[0x137] = 0xfff0000000000000;
  in_RDI[0x138] = 0x3ff0000000000000;
  *(undefined1 *)(in_RDI + 0x139) = 0;
  in_RDI[0x13a] = 0;
  in_RDI[0x13b] = 0;
  *(undefined4 *)(in_RDI + 0x13c) = 0;
  *(undefined4 *)((long)in_RDI + 0x9e4) = 0;
  *(undefined4 *)(in_RDI + 0x13d) = 0;
  *(undefined4 *)((long)in_RDI + 0x9ec) = 0;
  *(undefined4 *)(in_RDI + 0x13e) = 0;
  in_RDI[0x13f] = 0;
  in_RDI[0x140] = 0;
  in_RDI[0x141] = 0;
  in_RDI[0x142] = 0;
  in_RDI[0x143] = 0;
  in_RDI[0x144] = 0;
  in_RDI[0x145] = 0x3ff0000000000000;
  in_RDI[0x146] = 0x3ff0000000000000;
  in_RDI[0x147] = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x148) = 0;
  *(undefined4 *)((long)in_RDI + 0xa44) = 0;
  local_78 = in_RDI + 0x149;
  memset(local_78,0,0x910);
  do {
    std::__cxx11::string::string((string *)(local_78 + 6));
    std::__cxx11::string::string((string *)(local_78 + 10));
    std::__cxx11::string::string((string *)(local_78 + 0xe));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x4b39a8);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4b39b6);
    local_78 = local_78 + 0x1d;
  } while (local_78 != in_RDI + 0x26b);
  *(undefined4 *)(in_RDI + 0x26b) = 0;
  *(undefined4 *)((long)in_RDI + 0x135c) = 0;
  local_a0 = in_RDI + 0x26c;
  memset(local_a0,0,0xa50);
  do {
    local_a0 = local_a0 + 0xf;
  } while (local_a0 != in_RDI + 0x3b6);
  memset(in_RDI + 0x3b6,0,0x30);
  local_b8 = in_RDI + 0x3bc;
  this_00 = (HighsValueDistribution *)((long)in_RDI + 0x1dec);
  do {
    *(undefined4 *)local_b8 = 0;
    local_b8 = (undefined8 *)((long)local_b8 + 4);
  } while ((HighsValueDistribution *)local_b8 != this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  HighsValueDistribution::HighsValueDistribution(this_00);
  return;
}

Assistant:

HighsSimplexAnalysis()
      : timer_(nullptr),
        pointer_serial_factor_clocks(nullptr),
        numRow(0),
        numCol(0),
        numTot(0),
        model_name_(""),
        lp_name_(""),
        analyse_lp_data(false),
        analyse_simplex_summary_data(false),
        analyse_simplex_runtime_data(false),
        analyse_simplex_time(false),
        analyse_factor_data(false),
        analyse_factor_time(false),
        analyse_simplex_data(false),
        simplex_strategy(0),
        edge_weight_mode(EdgeWeightMode::kSteepestEdge),
        solve_phase(0),
        simplex_iteration_count(0),
        devex_iteration_count(0),
        pivotal_row_index(0),
        leaving_variable(0),
        entering_variable(0),
        rebuild_reason(0),
        rebuild_reason_string(""),
        reduced_rhs_value(0.0),
        reduced_cost_value(0.0),
        edge_weight(0.0),
        edge_weight_error(0.0),
        primal_delta(0.0),
        primal_step(0.0),
        dual_step(0.0),
        pivot_value_from_column(0.0),
        pivot_value_from_row(0.0),
        factor_pivot_threshold(0.0),
        numerical_trouble(0.0),
        objective_value(0.0),
        num_primal_infeasibility(0),
        num_dual_infeasibility(0),
        sum_primal_infeasibility(0.0),
        sum_dual_infeasibility(0.0),
        num_dual_phase_1_lp_dual_infeasibility(0),
        max_dual_phase_1_lp_dual_infeasibility(0.0),
        sum_dual_phase_1_lp_dual_infeasibility(0.0),
        num_devex_framework(0),
        col_aq_density(0.0),
        row_ep_density(0.0),
        row_ap_density(0.0),
        row_DSE_density(0.0),
        col_steepest_edge_density(0.0),
        col_basic_feasibility_change_density(0.0),
        row_basic_feasibility_change_density(0.0),
        col_BFRT_density(0.0),
        primal_col_density(0.0),
        dual_col_density(0.0),
        num_costly_DSE_iteration(0),
        costly_DSE_measure(0.0),
        multi_iteration_count(0),
        multi_chosen(0),
        multi_finished(0),
        min_concurrency(0),
        num_concurrency(0),
        max_concurrency(0),
        num_col_price(0),
        num_row_price(0),
        num_row_price_with_switch(0),
        num_primal_cycling_detections(0),
        num_dual_cycling_detections(0),
        num_quad_chuzc(0),
        num_heap_chuzc(0),
        sum_quad_chuzc_size(0.0),
        sum_heap_chuzc_size(0.0),
        max_quad_chuzc_size(0),
        max_heap_chuzc_size(0),
        num_improve_choose_column_row_call(0),
        num_remove_pivot_from_pack(0),
        num_correct_dual_primal_flip(0),
        min_correct_dual_primal_flip_dual_infeasibility(kHighsInf),
        max_correct_dual_primal_flip(0.0),
        num_correct_dual_cost_shift(0),
        max_correct_dual_cost_shift_dual_infeasibility(0.0),
        max_correct_dual_cost_shift(0.0),
        net_num_single_cost_shift(0),
        num_single_cost_shift(0),
        max_single_cost_shift(0.0),
        sum_single_cost_shift(0.0),
        num_dual_steepest_edge_weight_check(0),
        num_dual_steepest_edge_weight_reject(0),
        num_wrong_low_dual_steepest_edge_weight(0),
        num_wrong_high_dual_steepest_edge_weight(0),
        average_frequency_low_dual_steepest_edge_weight(0.0),
        average_frequency_high_dual_steepest_edge_weight(0.0),
        average_log_low_dual_steepest_edge_weight_error(0.0),
        average_log_high_dual_steepest_edge_weight_error(0.0),
        max_average_frequency_low_dual_steepest_edge_weight(0.0),
        max_average_frequency_high_dual_steepest_edge_weight(0.0),
        max_sum_average_frequency_extreme_dual_steepest_edge_weight(0.0),
        max_average_log_low_dual_steepest_edge_weight_error(0.0),
        max_average_log_high_dual_steepest_edge_weight_error(0.0),
        max_sum_average_log_extreme_dual_steepest_edge_weight_error(0.0),
        num_invert_report_since_last_header(-1),
        num_iteration_report_since_last_header(-1),
        highs_run_time(0.0),
        last_user_log_time(-kHighsInf),
        delta_user_log_time(1e0),
        timeless_log(false),
        average_concurrency(0.0),
        average_fraction_of_possible_minor_iterations_performed(0.0),
        sum_multi_chosen(0),
        sum_multi_finished(0),
        num_invert(0),
        num_kernel(0),
        num_major_kernel(0),
        max_kernel_dim(0.0),
        sum_kernel_dim(0.0),
        running_average_kernel_dim(0.0),
        sum_invert_fill_factor(0.0),
        sum_kernel_fill_factor(0.0),
        sum_major_kernel_fill_factor(0.0),
        running_average_invert_fill_factor(1.0),
        running_average_kernel_fill_factor(1.0),
        running_average_major_kernel_fill_factor(1.0),
        AnIterIt0(0),
        AnIterPrevIt(0),
        AnIterOp{},
        AnIterTraceNumRec(0),
        AnIterTraceIterDl(0),
        AnIterTrace{},
        AnIterNumInvert{},
        AnIterNumEdWtIt{} {}